

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,false,true>
               (unsigned_short *ldata,unsigned_short *rdata,unsigned_short *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ushort uVar5;
  ushort uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar6 = *rdata;
      iVar7 = 0;
      do {
        uVar5 = ldata[iVar7] >> ((byte)uVar6 & 0x1f);
        if (0xf < uVar6) {
          uVar5 = 0;
        }
        result_data[iVar7] = uVar5;
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = 0;
    uVar3 = 0;
    do {
      uVar2 = puVar1[uVar8];
      uVar9 = uVar3 + 0x40;
      if (count <= uVar3 + 0x40) {
        uVar9 = count;
      }
      uVar4 = uVar9;
      if (uVar2 != 0) {
        uVar4 = uVar3;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar3 < uVar9) {
            uVar6 = *rdata;
            do {
              uVar5 = ldata[uVar4] >> ((byte)uVar6 & 0x1f);
              if (0xf < uVar6) {
                uVar5 = 0;
              }
              result_data[uVar4] = uVar5;
              uVar4 = uVar4 + 1;
            } while (uVar9 != uVar4);
          }
        }
        else if (uVar3 < uVar9) {
          uVar4 = 0;
          do {
            if ((uVar2 >> (uVar4 & 0x3f) & 1) != 0) {
              uVar6 = ldata[uVar3 + uVar4] >> ((byte)*rdata & 0x1f);
              if (0xf < *rdata) {
                uVar6 = 0;
              }
              result_data[uVar3 + uVar4] = uVar6;
            }
            uVar4 = uVar4 + 1;
          } while ((uVar3 - uVar9) + uVar4 != 0);
          uVar4 = uVar3 + uVar4;
        }
      }
      uVar8 = uVar8 + 1;
      uVar3 = uVar4;
    } while (uVar8 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}